

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

mh_int_t mh_assoc_put(mh_assoc_t *h,assoc_val **node,assoc_val ***ret,void *arg)

{
  byte bVar1;
  int iVar2;
  int exist;
  mh_int_t x;
  void *arg_local;
  assoc_val ***ret_local;
  assoc_val **node_local;
  mh_assoc_t *h_local;
  
  exist = h->n_buckets;
  if (h->size != h->n_buckets) {
    if (h->resize_position == 0) {
      if ((h->upper_bound <= h->n_dirty) &&
         (iVar2 = mh_assoc_start_resize(h,h->n_buckets + 1,0,arg), iVar2 != 0)) {
        return exist;
      }
    }
    else {
      mh_assoc_resize(h,arg);
    }
    if (h->resize_position != 0) {
      mh_assoc_put(h->shadow,node,(assoc_val ***)0x0,arg);
    }
    exist = mh_assoc_put_slot(h,node,arg);
    bVar1 = (byte)exist;
    if ((h->b[(uint)exist >> 4] & 1 << (bVar1 & 0xf)) == 0) {
      h->b[(uint)exist >> 4] = 1 << (bVar1 & 0xf) | h->b[(uint)exist >> 4];
      h->size = h->size + 1;
      if ((h->b[(uint)exist >> 4] & 1 << ((bVar1 & 0xf) + 0x10 & 0x1f)) == 0) {
        h->n_dirty = h->n_dirty + 1;
      }
      h->p[(uint)exist] = *node;
      if (ret != (assoc_val ***)0x0) {
        *ret = (assoc_val **)0x0;
      }
    }
    else {
      if (ret != (assoc_val ***)0x0) {
        **ret = h->p[(uint)exist];
      }
      h->p[(uint)exist] = *node;
    }
  }
  return exist;
}

Assistant:

static inline mh_int_t
_mh(put)(struct _mh(t) *h, const mh_node_t *node, mh_node_t **ret,
	 mh_arg_t arg)
{
	mh_int_t x = mh_end(h);
	int exist;
	if (h->size == h->n_buckets)
		/* no one free elements in the hash table */
		goto put_done;

#if MH_INCREMENTAL_RESIZE
	if (mh_unlikely(h->resize_position > 0))
		_mh(resize)(h, arg);
	else if (mh_unlikely(h->n_dirty >= h->upper_bound)) {
		if (_mh(start_resize)(h, h->n_buckets + 1, 0, arg))
			goto put_done;
	}
	if (h->resize_position)
		_mh(put)(h->shadow, node, NULL, arg);
#else
	if (mh_unlikely(h->n_dirty >= h->upper_bound)) {
		if (_mh(start_resize)(h, h->n_buckets + 1, h->size,
				      arg))
			goto put_done;
	}
#endif

	x = put_slot(h, node, arg);
	exist = mh_exist(h, x);

	if (!exist) {
		/* add new */
		mh_setexist(h, x);
		h->size++;
		if (!mh_dirty(h, x))
			h->n_dirty++;

		memcpy(&(h->p[x]), node, sizeof(mh_node_t));
		if (ret)
			*ret = NULL;
	} else {
		if (ret)
			memcpy(*ret, &(h->p[x]), sizeof(mh_node_t));
		/* replace old */
		memcpy(&(h->p[x]), node, sizeof(mh_node_t));
	}

put_done:
	return x;
}